

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::Scene::readFrom(Scene *this,BinaryReader *binary)

{
  ulong uVar1;
  pointer puVar2;
  runtime_error *this_00;
  size_type __new_size;
  long lVar3;
  
  BinaryReader::read<pbrt::Film>(binary,&this->film);
  uVar1 = binary->currentEntityOffset + 8;
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar1 <= (ulong)((long)(binary->currentEntityData).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    __new_size = *(size_type *)(puVar2 + binary->currentEntityOffset);
    binary->currentEntityOffset = uVar1;
    std::vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>::
    resize(&this->cameras,__new_size);
    if (__new_size != 0) {
      lVar3 = 0;
      do {
        BinaryReader::read<pbrt::Camera>
                  (binary,(shared_ptr<pbrt::Camera> *)
                          ((long)&(((this->cameras).
                                    super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr + lVar3));
        lVar3 = lVar3 + 0x10;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
    BinaryReader::read<pbrt::Object>(binary,&this->world);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"invalid read attempt by entity - not enough data in data block!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Scene::readFrom(BinaryReader &binary) 
  {
    binary.read(film);
    binary.read(cameras);
    binary.read(world);
  }